

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_compress.hpp
# Opt level: O3

void __thiscall
duckdb::AlpRDCompressionState<float>::Append
          (AlpRDCompressionState<float> *this,UnifiedVectorFormat *vdata,idx_t count)

{
  EXACT_TYPE EVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  unsigned_long *puVar4;
  sel_t *psVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  long lVar9;
  idx_t idx_in_entry;
  ulong uVar10;
  idx_t iVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (count != 0) {
    pdVar2 = vdata->data;
    uVar13 = 0;
    do {
      iVar3 = this->vector_idx;
      uVar12 = 0x400 - iVar3;
      if (count <= 0x400 - iVar3) {
        uVar12 = count;
      }
      puVar4 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        if (iVar3 != 0x400) {
          psVar5 = vdata->sel->sel_vector;
          lVar9 = 0;
          do {
            if (psVar5 == (sel_t *)0x0) {
              uVar7 = uVar13 + lVar9;
            }
            else {
              uVar7 = (ulong)psVar5[uVar13 + lVar9];
            }
            this->input_vector[iVar3 + lVar9] = *(EXACT_TYPE *)(pdVar2 + uVar7 * 4);
            lVar9 = lVar9 + 1;
          } while (uVar12 + (uVar12 == 0) != lVar9);
        }
      }
      else if (iVar3 != 0x400) {
        psVar5 = vdata->sel->sel_vector;
        iVar8 = this->nulls_idx;
        lVar9 = uVar12 + (uVar12 == 0);
        uVar7 = uVar13;
        iVar11 = iVar3;
        do {
          uVar10 = uVar7;
          if (psVar5 != (sel_t *)0x0) {
            uVar10 = (ulong)psVar5[uVar7];
          }
          EVar1 = *(EXACT_TYPE *)(pdVar2 + uVar10 * 4);
          uVar6 = puVar4[uVar10 >> 6];
          this->vector_null_positions[iVar8] = (uint16_t)iVar11;
          iVar8 = (iVar8 + 1) - (ulong)((uVar6 >> (uVar10 & 0x3f) & 1) != 0);
          this->nulls_idx = iVar8;
          this->input_vector[iVar11] = EVar1;
          iVar11 = iVar11 + 1;
          uVar7 = uVar7 + 1;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      this->vector_idx = iVar3 + uVar12;
      if (iVar3 + uVar12 == 0x400) {
        CompressVector(this);
      }
      uVar13 = uVar13 + uVar12;
      count = count - uVar12;
    } while (count != 0);
  }
  return;
}

Assistant:

void Append(UnifiedVectorFormat &vdata, idx_t count) {
		auto data = UnifiedVectorFormat::GetData<T>(vdata);
		idx_t values_left_in_data = count;
		idx_t offset_in_data = 0;
		while (values_left_in_data > 0) {
			// We calculate until which value in data we must go to fill the input_vector
			// to avoid checking if input_vector is filled in each iteration
			auto values_to_fill_alp_input =
			    MinValue<idx_t>(AlpConstants::ALP_VECTOR_SIZE - vector_idx, values_left_in_data);
			if (vdata.validity.AllValid()) { //! We optimize a loop when there are no null
				for (idx_t i = 0; i < values_to_fill_alp_input; i++) {
					auto idx = vdata.sel->get_index(offset_in_data + i);
					EXACT_TYPE value = Load<EXACT_TYPE>(const_data_ptr_cast(&data[idx]));
					input_vector[vector_idx + i] = value;
				}
			} else {
				for (idx_t i = 0; i < values_to_fill_alp_input; i++) {
					auto idx = vdata.sel->get_index(offset_in_data + i);
					EXACT_TYPE value = Load<EXACT_TYPE>(const_data_ptr_cast(&data[idx]));
					bool is_null = !vdata.validity.RowIsValid(idx);
					//! We resolve null values with a predicated comparison
					vector_null_positions[nulls_idx] = UnsafeNumericCast<uint16_t>(vector_idx + i);
					nulls_idx += is_null;
					input_vector[vector_idx + i] = value;
				}
			}
			offset_in_data += values_to_fill_alp_input;
			values_left_in_data -= values_to_fill_alp_input;
			vector_idx += values_to_fill_alp_input;
			// We still need this check since we could have an incomplete input_vector at the end of data
			if (vector_idx == AlpConstants::ALP_VECTOR_SIZE) {
				CompressVector();
				D_ASSERT(vector_idx == 0);
			}
		}
	}